

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::TfLow(AbstractContentContext *this,string *inFontName,double inFontSize)

{
  double dVar1;
  EStatusCode EVar2;
  GraphicState *pGVar3;
  PrimitiveObjectsWriter *this_00;
  allocator<char> local_41;
  string local_40;
  double local_20;
  double inFontSize_local;
  string *inFontName_local;
  AbstractContentContext *this_local;
  
  local_20 = inFontSize;
  inFontSize_local = (double)inFontName;
  inFontName_local = (string *)this;
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  AssertProcsetAvailable(this,&KProcsetText_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteName(this_00,(string *)inFontSize_local,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_20,eTokenSeparatorSpace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Tf",&local_41);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  dVar1 = inFontSize_local;
  pGVar3 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  std::__cxx11::string::operator=((string *)&pGVar3->mPlacedFontName,(string *)dVar1);
  dVar1 = local_20;
  pGVar3 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  pGVar3->mPlacedFontSize = dVar1;
  EVar2 = GetCurrentStatusCode(this);
  return EVar2;
}

Assistant:

EStatusCode AbstractContentContext::TfLow(const std::string& inFontName,double inFontSize)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);
	AssertProcsetAvailable(KProcsetText);

	mPrimitiveWriter.WriteName(inFontName);
	mPrimitiveWriter.WriteDouble(inFontSize);
	mPrimitiveWriter.WriteKeyword("Tf");

	mGraphicStack.GetCurrentState().mPlacedFontName = inFontName;
	mGraphicStack.GetCurrentState().mPlacedFontSize = inFontSize;
	return GetCurrentStatusCode();
}